

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O3

uint64_t __thiscall kaitai::kstream::read_u8be(kstream *this)

{
  ulong local_10;
  
  std::istream::read((char *)this->m_io,(long)&local_10);
  return local_10 >> 0x38 | (local_10 & 0xff000000000000) >> 0x28 |
         (local_10 & 0xff0000000000) >> 0x18 | (local_10 & 0xff00000000) >> 8 |
         (local_10 & 0xff000000) << 8 | (local_10 & 0xff0000) << 0x18 | (local_10 & 0xff00) << 0x28
         | local_10 << 0x38;
}

Assistant:

uint64_t kaitai::kstream::read_u8be() {
    uint64_t t;
    m_io->read(reinterpret_cast<char *>(&t), 8);
#if __BYTE_ORDER == __LITTLE_ENDIAN
    t = bswap_64(t);
#endif
    return t;
}